

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O3

size_t Tools::leaf_index_nothrow(bitset_t *split)

{
  pointer puVar1;
  pointer puVar2;
  size_type sVar3;
  bool bVar4;
  size_type sVar5;
  long lVar6;
  long lVar7;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  
  puVar1 = (split->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (split->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar2 == puVar1) {
    lVar6 = 0;
  }
  else {
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + (ulong)(byte)boost::detail::dynamic_bitset_impl::count_table<true>::table
                                   [*(byte *)((long)puVar1 + lVar7)];
      lVar7 = lVar7 + 1;
    } while ((long)puVar2 - (long)puVar1 != lVar7);
  }
  sVar3 = split->m_num_bits;
  if (lVar6 == sVar3 - 1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~(&local_30,split)
    ;
    sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                      (&local_30,0);
    bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      (&local_30);
    if (!bVar4) {
      __assert_fail("m_check_invariants()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x279,
                    "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    if (local_30.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    sVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                      (split,0);
  }
  return sVar3 + ~sVar5;
}

Assistant:

size_t Tools::leaf_index_nothrow(const bitset_t split) {
    if (split.count() == split.size() - 1) {
        return split.size() - (~split).find_first() - 1;
    } else {
        return split.size() - split.find_first() - 1;
    }
}